

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O3

int tinf_decode_symbol(tinf_data *d,tinf_tree *t)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  uVar2 = tinf_getbits(d,1);
  iVar4 = 0;
  lVar5 = 1;
  do {
    uVar1 = t->counts[lVar5];
    if ((int)uVar2 < (int)(uint)uVar1) {
      if (uVar2 + iVar4 < 0x120) {
        return (int)t->symbols[uVar2 + iVar4];
      }
      __assert_fail("base + offs >= 0 && base + offs < 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/src/tinflate.c"
                    ,0x101,"int tinf_decode_symbol(struct tinf_data *, const struct tinf_tree *)");
    }
    iVar4 = iVar4 + (uint)uVar1;
    lVar5 = lVar5 + 1;
    uVar3 = tinf_getbits(d,1);
    uVar2 = uVar3 + (uVar2 - uVar1) * 2;
  } while (lVar5 != 0x10);
  __assert_fail("len <= 15",
                "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/src/tinflate.c",
                0xf7,"int tinf_decode_symbol(struct tinf_data *, const struct tinf_tree *)");
}

Assistant:

static int tinf_decode_symbol(struct tinf_data *d, const struct tinf_tree *t)
{
	int base = 0, offs = 0;
	int len;

	/*
	 * Get more bits while code index is above number of codes
	 *
	 * Rather than the actual code, we are computing the position of the
	 * code in the sorted order of codes, which is the index of the
	 * corresponding symbol.
	 *
	 * Conceptually, for each code length (level in the tree), there are
	 * counts[len] leaves on the left and internal nodes on the right.
	 * The index we have decoded so far is base + offs, and if that
	 * falls within the leaves we are done. Otherwise we adjust the range
	 * of offs and add one more bit to it.
	 */
	for (len = 1; ; ++len) {
		offs = 2 * offs + tinf_getbits(d, 1);

		assert(len <= 15);

		if (offs < t->counts[len]) {
			break;
		}

		base += t->counts[len];
		offs -= t->counts[len];
	}

	assert(base + offs >= 0 && base + offs < 288);

	return t->symbols[base + offs];
}